

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

void ma_device__on_data(ma_device *pDevice,void *pFramesOut,void *pFramesIn,ma_uint32 frameCount)

{
  ma_uint32 *pmVar1;
  ma_format mVar2;
  ma_uint32 mVar3;
  ma_device_type mVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ma_uint64 mVar11;
  ma_uint32 totalFramesProcessed;
  uint uVar12;
  int iVar13;
  
  if ((pDevice == (ma_device *)0x0) || (pDevice->state != ma_device_state_stopping)) {
    if (pDevice->noFixedSizedCallback != '\0') {
      ma_device__on_data_inner(pDevice,pFramesOut,pFramesIn,frameCount);
      return;
    }
    for (uVar12 = 0; uVar10 = frameCount - uVar12, uVar12 <= frameCount && uVar10 != 0;
        uVar12 = uVar12 + iVar13) {
      if (pFramesIn == (void *)0x0) {
        mVar11 = 0;
      }
      else {
        uVar7 = (pDevice->capture).intermediaryBufferCap;
        uVar9 = (pDevice->capture).intermediaryBufferLen;
        mVar11 = 0;
        uVar8 = uVar7 - uVar9;
        if (uVar9 <= uVar7 && uVar8 != 0) {
          if (uVar10 < uVar8) {
            uVar8 = uVar10;
          }
          mVar2 = (pDevice->capture).format;
          mVar3 = (pDevice->capture).channels;
          uVar5 = (ulong)(*(int *)(&DAT_001ad680 + (ulong)mVar2 * 4) * mVar3);
          ma_copy_pcm_frames((void *)(uVar9 * uVar5 + (long)(pDevice->capture).pIntermediaryBuffer),
                             (void *)(uVar12 * uVar5 + (long)pFramesIn),(ulong)uVar8,mVar2,mVar3);
          uVar9 = (pDevice->capture).intermediaryBufferLen + uVar8;
          (pDevice->capture).intermediaryBufferLen = uVar9;
          uVar7 = (pDevice->capture).intermediaryBufferCap;
          mVar11 = (ma_uint64)uVar8;
        }
        if ((uVar9 == uVar7) && (pDevice->type != ma_device_type_duplex)) {
          ma_device__on_data_inner(pDevice,(void *)0x0,(pDevice->capture).pIntermediaryBuffer,uVar7)
          ;
          (pDevice->capture).intermediaryBufferLen = 0;
        }
      }
      mVar4 = pDevice->type;
      if (pFramesOut == (void *)0x0) {
LAB_0019e283:
        iVar13 = (int)mVar11;
        if (mVar4 == ma_device_type_duplex) goto LAB_0019e28b;
      }
      else {
        uVar7 = (pDevice->playback).intermediaryBufferLen;
        if (uVar7 != 0) {
          if (uVar7 <= uVar10) {
            uVar10 = uVar7;
          }
          uVar5 = (ulong)uVar10;
          if (mVar4 == ma_device_type_duplex) {
            uVar5 = mVar11;
          }
          mVar2 = (pDevice->playback).format;
          mVar3 = (pDevice->playback).channels;
          uVar6 = (ulong)(*(int *)(&DAT_001ad680 + (ulong)mVar2 * 4) * mVar3);
          ma_copy_pcm_frames((void *)(uVar12 * uVar6 + (long)pFramesOut),
                             (void *)(((pDevice->playback).intermediaryBufferCap - uVar7) * uVar6 +
                                     (long)(pDevice->playback).pIntermediaryBuffer),uVar5,mVar2,
                             mVar3);
          pmVar1 = &(pDevice->playback).intermediaryBufferLen;
          *pmVar1 = *pmVar1 - (int)uVar5;
          mVar4 = pDevice->type;
          mVar11 = uVar5;
          if (*pmVar1 != 0) goto LAB_0019e283;
        }
        iVar13 = (int)mVar11;
        if (mVar4 != ma_device_type_duplex) {
          ma_device__on_data_inner
                    (pDevice,(pDevice->playback).pIntermediaryBuffer,(void *)0x0,
                     (pDevice->playback).intermediaryBufferCap);
          (pDevice->playback).intermediaryBufferLen = (pDevice->playback).intermediaryBufferCap;
          mVar4 = pDevice->type;
          goto LAB_0019e283;
        }
LAB_0019e28b:
        mVar3 = (pDevice->capture).intermediaryBufferLen;
        if (mVar3 == (pDevice->capture).intermediaryBufferCap) {
          ma_device__on_data_inner
                    (pDevice,(pDevice->playback).pIntermediaryBuffer,
                     (pDevice->capture).pIntermediaryBuffer,mVar3);
          (pDevice->playback).intermediaryBufferLen = (pDevice->playback).intermediaryBufferCap;
          (pDevice->capture).intermediaryBufferLen = 0;
        }
      }
    }
  }
  return;
}

Assistant:

static void ma_device__on_data(ma_device* pDevice, void* pFramesOut, const void* pFramesIn, ma_uint32 frameCount)
{
    MA_ASSERT(pDevice != NULL);

    /* Don't read more data from the client if we're in the process of stopping. */
    if (ma_device_get_state(pDevice) == ma_device_state_stopping) {
        return;
    }

    if (pDevice->noFixedSizedCallback) {
        /* Fast path. Not using a fixed sized callback. Process directly from the specified buffers. */
        ma_device__on_data_inner(pDevice, pFramesOut, pFramesIn, frameCount);
    } else {
        /* Slow path. Using a fixed sized callback. Need to use the intermediary buffer. */
        ma_uint32 totalFramesProcessed = 0;

        while (totalFramesProcessed < frameCount) {
            ma_uint32 totalFramesRemaining = frameCount - totalFramesProcessed;
            ma_uint32 framesToProcessThisIteration = 0;

            if (pFramesIn != NULL) {
                /* Capturing. Write to the intermediary buffer. If there's no room, fire the callback to empty it. */
                if (pDevice->capture.intermediaryBufferLen < pDevice->capture.intermediaryBufferCap) {
                    /* There's some room left in the intermediary buffer. Write to it without firing the callback. */
                    framesToProcessThisIteration = totalFramesRemaining;
                    if (framesToProcessThisIteration > pDevice->capture.intermediaryBufferCap - pDevice->capture.intermediaryBufferLen) {
                        framesToProcessThisIteration = pDevice->capture.intermediaryBufferCap - pDevice->capture.intermediaryBufferLen;
                    }

                    ma_copy_pcm_frames(
                        ma_offset_pcm_frames_ptr(pDevice->capture.pIntermediaryBuffer, pDevice->capture.intermediaryBufferLen, pDevice->capture.format, pDevice->capture.channels),
                        ma_offset_pcm_frames_const_ptr(pFramesIn, totalFramesProcessed, pDevice->capture.format, pDevice->capture.channels),
                        framesToProcessThisIteration,
                        pDevice->capture.format, pDevice->capture.channels);

                    pDevice->capture.intermediaryBufferLen += framesToProcessThisIteration;
                }

                if (pDevice->capture.intermediaryBufferLen == pDevice->capture.intermediaryBufferCap) {
                    /* No room left in the intermediary buffer. Fire the data callback. */
                    if (pDevice->type == ma_device_type_duplex) {
                        /* We'll do the duplex data callback later after we've processed the playback data. */
                    } else {
                        ma_device__on_data_inner(pDevice, NULL, pDevice->capture.pIntermediaryBuffer, pDevice->capture.intermediaryBufferCap);

                        /* The intermediary buffer has just been drained. */
                        pDevice->capture.intermediaryBufferLen = 0;
                    }
                }
            }

            if (pFramesOut != NULL) {
                /* Playing back. Read from the intermediary buffer. If there's nothing in it, fire the callback to fill it. */
                if (pDevice->playback.intermediaryBufferLen > 0) {
                    /* There's some content in the intermediary buffer. Read from that without firing the callback. */
                    if (pDevice->type == ma_device_type_duplex) {
                        /* The frames processed this iteration for a duplex device will always be based on the capture side. Leave it unmodified. */
                    } else {
                        framesToProcessThisIteration = totalFramesRemaining;
                        if (framesToProcessThisIteration > pDevice->playback.intermediaryBufferLen) {
                            framesToProcessThisIteration = pDevice->playback.intermediaryBufferLen;
                        }
                    }

                    ma_copy_pcm_frames(
                        ma_offset_pcm_frames_ptr(pFramesOut, totalFramesProcessed, pDevice->playback.format, pDevice->playback.channels),
                        ma_offset_pcm_frames_ptr(pDevice->playback.pIntermediaryBuffer, pDevice->playback.intermediaryBufferCap - pDevice->playback.intermediaryBufferLen, pDevice->playback.format, pDevice->playback.channels),
                        framesToProcessThisIteration,
                        pDevice->playback.format, pDevice->playback.channels);

                    pDevice->playback.intermediaryBufferLen -= framesToProcessThisIteration;
                }

                if (pDevice->playback.intermediaryBufferLen == 0) {
                    /* There's nothing in the intermediary buffer. Fire the data callback to fill it. */
                    if (pDevice->type == ma_device_type_duplex) {
                        /* In duplex mode, the data callback will be fired later. Nothing to do here. */
                    } else {
                        ma_device__on_data_inner(pDevice, pDevice->playback.pIntermediaryBuffer, NULL, pDevice->playback.intermediaryBufferCap);

                        /* The intermediary buffer has just been filled. */
                        pDevice->playback.intermediaryBufferLen = pDevice->playback.intermediaryBufferCap;
                    }
                }   
            }

            /* If we're in duplex mode we might need to do a refill of the data. */
            if (pDevice->type == ma_device_type_duplex) {
                if (pDevice->capture.intermediaryBufferLen == pDevice->capture.intermediaryBufferCap) {
                    ma_device__on_data_inner(pDevice, pDevice->playback.pIntermediaryBuffer, pDevice->capture.pIntermediaryBuffer, pDevice->capture.intermediaryBufferCap);

                    pDevice->playback.intermediaryBufferLen = pDevice->playback.intermediaryBufferCap;  /* The playback buffer will have just been filled. */
                    pDevice->capture.intermediaryBufferLen  = 0;                                        /* The intermediary buffer has just been drained. */
                }
            }

            /* Make sure this is only incremented once in the duplex case. */
            totalFramesProcessed += framesToProcessThisIteration;
        }
    }
}